

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container.hpp
# Opt level: O1

void __thiscall
bal::Container<unsigned_int>::Container(Container<unsigned_int> *this,container_size_t size)

{
  uint *puVar1;
  
  this->data_ = (uint *)0x0;
  this->size_ = 0;
  this->allocated_size_ = 0;
  if (size != 0) {
    puVar1 = (uint *)malloc((ulong)size << 2);
    this->data_ = puVar1;
    if (puVar1 == (uint *)0x0) {
      __assert_fail("data_ != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/vsklad[P]cgraph/bal/base/container.hpp"
                    ,0x37,
                    "void bal::Container<unsigned int>::resize_(const container_size_t) [T = unsigned int]"
                   );
    }
    this->size_ = 0;
    this->allocated_size_ = size;
  }
  this->size_ = size;
  return;
}

Assistant:

Container(const container_size_t size) {
            reserve(size);
            size_ = size;
            /* append(T(0), size); */
        }